

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O1

void __thiscall
deqp::gls::RandomShaderProgram::RandomShaderProgram
          (RandomShaderProgram *this,Shader *vertexShader,Shader *fragmentShader,
          int numUnifiedUniforms,ShaderInput **unifiedUniforms)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Type TVar4;
  ShaderInput *pSVar5;
  iterator __position;
  Shader *this_00;
  ShaderProgramDeclaration *this_01;
  Variable *pVVar6;
  InternalError *pIVar7;
  uint uVar8;
  ulong uVar9;
  GenericVecType GVar10;
  Variable *pVVar12;
  pointer ppSVar13;
  Variable *vertexOutput;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  VertexAttribute local_1e8;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  Sampler2DMap *local_1a0;
  Shader *local_198;
  Shader *local_190;
  FragmentSource local_188;
  long *local_168;
  long local_160;
  long local_158 [2];
  ShaderProgramDeclaration local_148;
  int iVar11;
  
  local_1a0 = (Sampler2DMap *)unifiedUniforms;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_148);
  local_190 = vertexShader;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,(vertexShader->m_source)._M_dataplus._M_p,&local_1e9);
  local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
  this_01 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(VertexSource *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,(fragmentShader->m_source)._M_dataplus._M_p,&local_1ea);
  paVar3 = &local_188.source.field_2;
  local_188.source._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_168,local_160 + (long)local_168);
  sglr::pdec::ShaderProgramDeclaration::operator<<(this_01,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.source._M_dataplus._M_p != paVar3) {
    operator_delete(local_188.source._M_dataplus._M_p,
                    local_188.source.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
    operator_delete(local_1e8.name._M_dataplus._M_p,local_1e8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  ppSVar13 = (local_190->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_198 = fragmentShader;
  if (ppSVar13 !=
      (local_190->m_inputs).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pSVar5 = *ppSVar13;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,(pSVar5->m_variable->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_188);
      TVar4 = (pSVar5->m_variable->m_type).m_baseType;
      local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
      local_1e8.type = TVar4 == TYPE_INT ^ GENERICVECTYPE_LAST;
      if (TVar4 == TYPE_FLOAT) {
        local_1e8.type = GENERICVECTYPE_FLOAT;
      }
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,&local_1e8);
      fragmentShader = local_198;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      ppSVar13 = ppSVar13 + 1;
    } while (ppSVar13 !=
             (local_190->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppSVar13 = (fragmentShader->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppSVar13 !=
      (fragmentShader->m_inputs).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      TVar4 = ((*ppSVar13)->m_variable->m_type).m_baseType;
      uVar8 = TVar4 == TYPE_INT ^ 3;
      if (TVar4 == TYPE_FLOAT) {
        uVar8 = 0;
      }
      local_1e8.name._M_dataplus._M_p._0_5_ = (uint5)uVar8;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                (&local_148,(VertexToFragmentVarying *)&local_1e8);
      ppSVar13 = ppSVar13 + 1;
    } while (ppSVar13 !=
             (fragmentShader->m_inputs).
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (0 < numUnifiedUniforms) {
    uVar9 = 0;
    do {
      pSVar5 = *(ShaderInput **)((long)local_1a0 + uVar9 * 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,(pSVar5->m_variable->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_188);
      pVVar6 = pSVar5->m_variable;
      TVar4 = (pVVar6->m_type).m_baseType;
      switch(TVar4) {
      case TYPE_FLOAT:
        iVar11 = 0;
        break;
      case TYPE_INT:
        iVar11 = 0x1a;
        break;
      case TYPE_BOOL:
        iVar11 = 0x5d;
        if (TVar4 == TYPE_BOOL) {
          iVar11 = 0x22;
        }
        break;
      default:
        GVar10 = 0x5e;
        if (TVar4 == TYPE_SAMPLER_CUBE) {
          GVar10 = 0x29;
        }
        goto LAB_018d9807;
      case TYPE_SAMPLER_2D:
        GVar10 = 0x28;
        goto LAB_018d9807;
      }
      GVar10 = iVar11 + (pVVar6->m_type).m_numElements;
LAB_018d9807:
      local_1e8.name._M_dataplus._M_p = (pointer)&local_1e8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_1c0,local_1b8 + (long)local_1c0);
      local_1e8.type = GVar10;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(Uniform *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      uVar9 = uVar9 + 1;
    } while ((uint)numUnifiedUniforms != uVar9);
  }
  local_1e8.name._M_dataplus._M_p = local_1e8.name._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_148,(FragmentOutput *)&local_1e8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_148);
  this_00 = local_198;
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_148);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_021cf0e0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_021cf118;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_021cf130;
  this->m_vertexShader = local_190;
  this->m_fragmentShader = this_00;
  this->m_numUnifiedUniforms = numUnifiedUniforms;
  this->m_unifiedUniforms = (ShaderInput **)local_1a0;
  pVVar6 = findShaderOutputByName(local_190,"gl_Position");
  this->m_positionVar = pVVar6;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rsg::Shader::getOutputs
            (this_00,(vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                     &local_148);
  for (pVVar6 = (Variable *)
                local_148.m_vertexAttributes.
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar6 != (Variable *)
                local_148.m_vertexAttributes.
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVVar6 = (Variable *)&(pVVar6->m_type).m_typeName) {
    pVVar12 = *(Variable **)&pVVar6->m_type;
    if (pVVar12->m_layoutLocation == 0) goto LAB_018d9977;
  }
  pVVar12 = (Variable *)0x0;
LAB_018d9977:
  if ((Variable *)
      local_148.m_vertexAttributes.
      super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
      _M_impl.super__Vector_impl_data._M_start != (Variable *)0x0) {
    operator_delete(local_148.m_vertexAttributes.
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.m_vertexAttributes.
                          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.m_vertexAttributes.
                          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->m_fragColorVar = pVVar12;
  local_1a0 = &this->m_sampler2DMap;
  p_Var1 = &(this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rsg::ExecutionContext::ExecutionContext(&this->m_execCtx,local_1a0,&this->m_samplerCubeMap);
  pVVar6 = this->m_positionVar;
  if (((pVVar6 == (Variable *)0x0) || ((pVVar6->m_type).m_baseType != TYPE_FLOAT)) ||
     ((pVVar6->m_type).m_numElements != 4)) {
    pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar7,(char *)0x0,
               "m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8d);
  }
  else {
    pVVar6 = this->m_fragColorVar;
    if (((pVVar6 != (Variable *)0x0) && ((pVVar6->m_type).m_baseType == TYPE_FLOAT)) &&
       ((pVVar6->m_type).m_numElements == 4)) {
      ppSVar13 = (local_198->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      if (ppSVar13 !=
          (local_198->m_inputs).
          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          local_148.m_vertexAttributes.
          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)findShaderOutputByName
                                  (local_190,((*ppSVar13)->m_variable->m_name)._M_dataplus._M_p);
          if ((Variable *)
              local_148.m_vertexAttributes.
              super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
              ._M_impl.super__Vector_impl_data._M_start == (Variable *)0x0) {
            pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (pIVar7,(char *)0x0,"vertexOutput",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
                       ,0x96);
            __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
          __position._M_current =
               (this->m_vertexOutputs).
               super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_vertexOutputs).
              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>::
            _M_realloc_insert<rsg::Variable_const*const&>
                      ((vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>> *)
                       &this->m_vertexOutputs,__position,(Variable **)&local_148);
          }
          else {
            *__position._M_current =
                 (Variable *)
                 local_148.m_vertexAttributes.
                 super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pppVVar2 = &(this->m_vertexOutputs).
                        super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          ppSVar13 = ppSVar13 + 1;
        } while (ppSVar13 !=
                 (local_198->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      return;
    }
    pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar7,(char *)0x0,
               "m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8e);
  }
  __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RandomShaderProgram::RandomShaderProgram (const rsg::Shader& vertexShader, const rsg::Shader& fragmentShader, int numUnifiedUniforms, const rsg::ShaderInput* const* unifiedUniforms)
	: sglr::ShaderProgram	(generateProgramDeclaration(vertexShader, fragmentShader, numUnifiedUniforms, unifiedUniforms))
	, m_vertexShader		(vertexShader)
	, m_fragmentShader		(fragmentShader)
	, m_numUnifiedUniforms	(numUnifiedUniforms)
	, m_unifiedUniforms		(unifiedUniforms)
	, m_positionVar			(findShaderOutputByName(vertexShader, "gl_Position"))
	, m_fragColorVar		(findShaderOutputByLocation(fragmentShader, 0))
	, m_execCtx				(m_sampler2DMap, m_samplerCubeMap)
{
	TCU_CHECK_INTERNAL(m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4);
	TCU_CHECK_INTERNAL(m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4);

	// Build list of vertex outputs.
	for (vector<rsg::ShaderInput*>::const_iterator fragInIter = fragmentShader.getInputs().begin(); fragInIter != fragmentShader.getInputs().end(); ++fragInIter)
	{
		const rsg::ShaderInput*	fragInput		= *fragInIter;
		const rsg::Variable*	vertexOutput	= findShaderOutputByName(vertexShader, fragInput->getVariable()->getName());

		TCU_CHECK_INTERNAL(vertexOutput);
		m_vertexOutputs.push_back(vertexOutput);
	}
}